

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall PathTracer::create_noise_images(PathTracer *this,shared_ptr<myvk::Device> *device)

{
  long in_RDI;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *this_00;
  shared_ptr<myvk::Image> *__r;
  shared_ptr<myvk::Image> *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff90;
  VkImageViewType in_stack_ffffffffffffff94;
  undefined1 request_anisotropy;
  float in_stack_ffffffffffffff98;
  VkSamplerMipmapMode in_stack_ffffffffffffff9c;
  VkSamplerAddressMode in_stack_ffffffffffffffa0;
  VkFilter in_stack_ffffffffffffffa4;
  Ptr<Device> *in_stack_ffffffffffffffa8;
  VkImageUsageFlags in_stack_ffffffffffffffb4;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> size;
  Ptr<Device> *device_00;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_ffffffffffffffe0;
  
  peVar1 = (element_type *)0x0;
  size._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  device_00 = (Ptr<Device> *)0x0;
  __r = (shared_ptr<myvk::Image> *)&stack0xffffffffffffffb8;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x16e990);
  myvk::Image::CreateTexture2D
            (device_00,(VkExtent2D *)size._M_pi,(uint32_t)((ulong)peVar1 >> 0x20),(VkFormat)peVar1,
             in_stack_ffffffffffffffb4,in_stack_ffffffffffffffe0);
  this_00 = (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            (in_RDI + 0xd8);
  std::shared_ptr<myvk::Image>::operator=(in_stack_ffffffffffffff40,__r);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x16e9f5);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (this_00);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)in_stack_ffffffffffffff40,__r);
  myvk::ImageView::Create
            ((Ptr<ImageBase> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94,(VkImageAspectFlags)in_stack_ffffffffffffff90);
  request_anisotropy = (undefined1)(in_stack_ffffffffffffff94 >> 0x18);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)in_stack_ffffffffffffff40,
             (shared_ptr<myvk::ImageView> *)__r);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x16ea4e);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x16ea58);
  myvk::Sampler::Create
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(bool)request_anisotropy,
             in_stack_ffffffffffffff90);
  std::shared_ptr<myvk::Sampler>::operator=
            ((shared_ptr<myvk::Sampler> *)in_stack_ffffffffffffff40,(shared_ptr<myvk::Sampler> *)__r
            );
  std::shared_ptr<myvk::Sampler>::~shared_ptr((shared_ptr<myvk::Sampler> *)0x16eaab);
  return;
}

Assistant:

void PathTracer::create_noise_images(const std::shared_ptr<myvk::Device> &device) {
	m_noise_image = myvk::Image::CreateTexture2D(device, {kNoiseSize, kNoiseSize}, 1, VK_FORMAT_R8G8_UNORM,
	                                             VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_SAMPLED_BIT);
	m_noise_image_view = myvk::ImageView::Create(m_noise_image, VK_IMAGE_VIEW_TYPE_2D);
	m_noise_sampler = myvk::Sampler::Create(device, VK_FILTER_NEAREST, VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE);
}